

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inner_product_impl.h
# Opt level: O1

size_t secp256k1_bulletproof_innerproduct_proof_length(size_t n)

{
  bool bVar1;
  size_t ret;
  long lVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  
  if (n < 2) {
    return n << 6 | 0x20;
  }
  lVar3 = 0x40;
  lVar2 = 0;
  sVar5 = n;
  do {
    lVar2 = lVar2 + (ulong)((uint)sVar5 & 1);
    sVar5 = sVar5 >> 1;
    lVar3 = lVar3 + -1;
  } while (lVar3 != 0);
  uVar4 = n >> 1 & 0x3fffffffffffffff;
  if (uVar4 < 9) {
    lVar3 = *(long *)(&DAT_00130420 + uVar4 * 8);
  }
  else {
    lVar3 = 0;
    do {
      lVar3 = lVar3 + 1;
      bVar1 = 3 < uVar4;
      uVar4 = uVar4 >> 1;
    } while (bVar1);
  }
  return (lVar3 * 2 + 7U >> 3) + (lVar2 + lVar3) * 0x40 + 0x60;
}

Assistant:

size_t secp256k1_bulletproof_innerproduct_proof_length(size_t n) {
    if (n < IP_AB_SCALARS / 2) {
        return 32 * (1 + 2 * n);
    } else {
        size_t bit_count = secp256k1_popcountl(n);
        size_t log = secp256k1_floor_lg(2 * n / IP_AB_SCALARS);
        return 32 * (1 + 2 * (bit_count - 1 + log) + IP_AB_SCALARS) + (2*log + 7) / 8;
    }
}